

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_> * __thiscall
QHash<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_>::operator[]
          (QHash<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_> *this
          ,QGraphicsItem **key)

{
  pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_> *ppVar1;
  long in_FS_OFFSET;
  QGraphicsItem **in_stack_ffffffffffffffb8;
  QHash<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_> local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  tryEmplace<>(local_20,in_stack_ffffffffffffffb8);
  ppVar1 = iterator::operator*((iterator *)0x9e0a33);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return ppVar1;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }